

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.h
# Opt level: O2

uint64_t xNextLong(Xoroshiro *xr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = xr->lo;
  uVar1 = xr->hi + uVar2;
  uVar3 = xr->hi ^ uVar2;
  xr->lo = uVar3 << 0x15 ^ (uVar2 << 0x31 | uVar2 >> 0xf) ^ uVar3;
  xr->hi = uVar3 << 0x1c | uVar3 >> 0x24;
  return (uVar1 * 0x20000 | uVar1 >> 0x2f) + uVar2;
}

Assistant:

static inline uint64_t xNextLong(Xoroshiro *xr)
{
    uint64_t l = xr->lo;
    uint64_t h = xr->hi;
    uint64_t n = rotl64(l + h, 17) + l;
    h ^= l;
    xr->lo = rotl64(l, 49) ^ h ^ (h << 21);
    xr->hi = rotl64(h, 28);
    return n;
}